

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int __thiscall SQLite::Statement::tryExecuteStep(Statement *this)

{
  element_type *pStmt;
  int ret;
  Statement *this_local;
  
  if ((this->mbDone & 1U) == 0) {
    pStmt = std::__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(this->mpPreparedStatement).
                        super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>);
    this_local._4_4_ = sqlite3_step(pStmt);
    if (this_local._4_4_ == 100) {
      this->mbHasRow = true;
    }
    else {
      this->mbHasRow = false;
      this->mbDone = this_local._4_4_ == 0x65;
    }
  }
  else {
    this_local._4_4_ = 0x15;
  }
  return this_local._4_4_;
}

Assistant:

int Statement::tryExecuteStep() noexcept
{
    if (mbDone)
    {
        return SQLITE_MISUSE; // Statement needs to be reseted !
    }

    const int ret = sqlite3_step(mpPreparedStatement.get());
    if (SQLITE_ROW == ret) // one row is ready : call getColumn(N) to access it
    {
        mbHasRow = true;
    }
    else
    {
        mbHasRow = false;
        mbDone = SQLITE_DONE == ret; // check if the query has finished executing
    }
    return ret;
}